

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O3

void test_service_names(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  undefined1 local_e0 [2];
  uint16_t local_de;
  uint32_t local_dc;
  nng_sockaddr sa;
  char *pcStack_50;
  undefined8 local_48;
  undefined1 *local_40;
  nni_aio *local_30;
  nng_aio *aio;
  uint32_t port;
  
  sa.s_storage.sa_pad[0xf] = 0;
  pcStack_50 = (char *)0x0;
  local_48 = 0;
  nVar2 = nng_aio_alloc(&local_30,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x8d,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar4,nVar2);
  if (iVar3 != 0) {
    pcStack_50 = "8.8.4.4";
    local_48 = CONCAT62(local_48._2_6_,0x50);
    sa.s_storage.sa_pad[0xf]._0_5_ = 0x100000003;
    local_40 = local_e0;
    nni_resolv((nni_resolv_item *)(sa.s_ipc.sa_path + 0x7e),local_30);
    nng_aio_wait(local_30);
    nVar2 = nng_aio_result(local_30);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                           ,0x95,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar4,
                           nVar2);
    if (iVar3 != 0) {
      uVar1 = nuts_be16((uint16_t)iVar3);
      acutest_check_((uint)(local_de == uVar1),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x96,"%s","sa.s_in.sa_port == nuts_be16(80)");
      local_dc = nuts_be32(0x8080404);
      acutest_check_((uint)(local_dc != 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x97,"%s","sa.s_in.sa_addr = nuts_be32(0x08080404)");
      nng_aio_free(local_30);
      nVar2 = nni_get_port_by_name("http",(uint32_t *)((long)&aio + 4));
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                             ,0x9a,"%s: expected success, got %s (%d)",
                             "nni_get_port_by_name(\"http\", &port)",pcVar4,nVar2);
      if (iVar3 != 0) {
        acutest_check_((uint)(aio._4_4_ == 0x50),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                       ,0x9b,"%s","port == 80");
        nVar2 = nni_get_port_by_name("25",(uint32_t *)((long)&aio + 4));
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                               ,0x9d,"%s: expected success, got %s (%d)",
                               "nni_get_port_by_name(\"25\", &port)",pcVar4,nVar2);
        if (iVar3 != 0) {
          acutest_check_((uint)(aio._4_4_ == 0x19),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x9e,"%s","port == 25");
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_service_names(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	uint32_t        port;
	nni_resolv_item item = { 0 };

	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	item.ri_family  = NNG_AF_INET;
	item.ri_host    = "8.8.4.4";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in.sa_port == nuts_be16(80));
	NUTS_TRUE(sa.s_in.sa_addr = nuts_be32(0x08080404));
	nng_aio_free(aio);

	NUTS_PASS(nni_get_port_by_name("http", &port));
	NUTS_TRUE(port == 80);

	NUTS_PASS(nni_get_port_by_name("25", &port));
	NUTS_TRUE(port == 25);
}